

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalOpenEvent
                    (CPalThread *pthr,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phEvent)

{
  PAL_ERROR PVar1;
  size_t sVar2;
  LPCWSTR local_50;
  CPalString sObjectName;
  long *local_38;
  IPalObject *pobjEvent;
  
  local_38 = (long *)0x0;
  sObjectName.m_dwStringLength = dwDesiredAccess;
  sObjectName.m_dwMaxLength = bInheritHandle;
  sVar2 = PAL_wcslen(lpName);
  sObjectName.m_pwsz._0_4_ = (int)sVar2;
  sObjectName.m_pwsz._4_4_ = (int)sObjectName.m_pwsz + 1;
  local_50 = lpName;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21b);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (lpName == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21c);
    fprintf(_stderr,"Expression: NULL != lpName\n");
  }
  if (phEvent == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21d);
    fprintf(_stderr,"Expression: NULL != phEvent\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    PVar1 = (**(code **)(*g_pObjectManager + 0x10))
                      (g_pObjectManager,pthr,&local_50,&aotEvent,&local_38);
    if (PVar1 == 0) {
      PVar1 = (**(code **)(*g_pObjectManager + 0x18))
                        (g_pObjectManager,pthr,local_38,sObjectName.m_dwStringLength,
                         sObjectName.m_dwMaxLength != 0,0,phEvent);
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 0x40))(local_38,pthr);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenEvent(
    CPalThread *pthr,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phEvent
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    CPalString sObjectName(lpName);

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != lpName);
    _ASSERTE(NULL != phEvent);

    ENTRY("InternalOpenEvent(pthr=%p, dwDesiredAccess=%#x, bInheritHandle=%d, "
        "lpName=%p, phEvent=%p)\n",
        pthr,
        dwDesiredAccess,
        bInheritHandle,
        lpName,
        phEvent
        );

    palError = g_pObjectManager->LocateObject(
        pthr,
        &sObjectName,
        &aotEvent,
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenEventExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pthr,
        pobjEvent,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenEventExit;
    }

InternalOpenEventExit:

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalOpenEvent returns %d\n", palError);
    
    return palError;
}